

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

bool __thiscall
boost::ext::ut::v1_1_8::runner<boost::ext::ut::v1_1_8::reporter<boost::ext::ut::v1_1_8::printer>,16>
::filter::operator()
          (void *this,size_t level,
          array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL> *path)

{
  string_view input;
  string_view pattern;
  bool bVar1;
  ulong uVar2;
  unsigned_long *puVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  size_type local_40;
  undefined1 *local_38;
  uint local_2c;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL> *paStack_28;
  uint i;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL> *path_local;
  size_t level_local;
  filter *this_local;
  
  local_2c = 0;
  paStack_28 = path;
  path_local = (array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL> *)level;
  level_local = (size_t)this;
  while( true ) {
    uVar2 = (ulong)local_2c;
    local_38 = (undefined1 *)((long)&path_local->_M_elems[0]._M_len + 1);
    local_40 = std::
               size<std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
                         ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)this);
    puVar3 = math::min_value<unsigned_long>((unsigned_long *)&local_38,&local_40);
    if (*puVar3 <= uVar2) {
      return true;
    }
    pvVar4 = std::array<std::basic_string_view<char,_std::char_traits<char>_>,_16UL>::operator[]
                       (paStack_28,(ulong)local_2c);
    input._M_len = pvVar4->_M_len;
    input._M_str = pvVar4->_M_str;
    pvVar5 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::operator[]((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                           *)this,(ulong)local_2c);
    pattern._M_len = pvVar5->_M_len;
    pattern._M_str = pvVar5->_M_str;
    bVar1 = utility::is_match(input,pattern);
    if (!bVar1) break;
    local_2c = local_2c + 1;
  }
  return false;
}

Assistant:

constexpr auto operator()(const std::size_t level,
                                const TPath& path) const -> bool {
        for (auto i = 0u; i < math::min_value(level + 1, std::size(path_));
             ++i) {
          if (not utility::is_match(path[i], path_[i])) {
            return false;
          }
        }
        return true;
      }